

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator*=(TPZFMatrix<long> *this,long value)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  
  lVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (0 < lVar2) {
    plVar3 = this->fElem;
    plVar1 = plVar3 + lVar2;
    do {
      *plVar3 = *plVar3 * value;
      plVar3 = plVar3 + 1;
    } while (plVar3 < plVar1);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}